

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bus.hpp
# Opt level: O3

void __thiscall Atari2600::Bus::Bus(Bus *this)

{
  uint uVar1;
  
  this->_vptr_Bus = (_func_int **)&PTR__Bus_00595a60;
  (this->mos6532_).super_MOS6532<Atari2600::PIA>.timer_.activeShift = 10;
  (this->mos6532_).super_MOS6532<Atari2600::PIA>.timer_.writtenShift = 10;
  (this->mos6532_).super_MOS6532<Atari2600::PIA>.timer_.interrupt_enabled = false;
  (this->mos6532_).super_MOS6532<Atari2600::PIA>.interrupt_line_ = false;
  (this->mos6532_).super_MOS6532<Atari2600::PIA>.a7_interrupt_.enabled = false;
  (this->mos6532_).super_MOS6532<Atari2600::PIA>.a7_interrupt_.active_on_positive = false;
  (this->mos6532_).super_MOS6532<Atari2600::PIA>.a7_interrupt_.last_port_value = '\0';
  (this->mos6532_).super_MOS6532<Atari2600::PIA>.port_[0].output_mask = '\0';
  (this->mos6532_).super_MOS6532<Atari2600::PIA>.port_[0].output = '\0';
  (this->mos6532_).super_MOS6532<Atari2600::PIA>.port_[1].output_mask = '\0';
  (this->mos6532_).super_MOS6532<Atari2600::PIA>.port_[1].output = '\0';
  (this->mos6532_).super_MOS6532<Atari2600::PIA>.interrupt_status_ = '\0';
  uVar1 = rand();
  (this->mos6532_).super_MOS6532<Atari2600::PIA>.timer_.value = (uVar1 & 0xff) << 10;
  *(undefined2 *)&(this->mos6532_).super_MOS6532<Atari2600::PIA>.field_0x99 = 0xffff;
  TIA::TIA(&this->tia_);
  Concurrency::AsyncTaskQueue<false,_true,_void>::AsyncTaskQueue<>(&this->audio_queue_);
  TIASound::TIASound(&this->tia_sound_,&this->audio_queue_);
  Outputs::Speaker::PullLowpass<Atari2600::TIASound>::PullLowpass(&this->speaker_,&this->tia_sound_)
  ;
  this->tia_input_value_[0] = 0xff;
  this->tia_input_value_[1] = 0xff;
  (this->cycles_since_speaker_update_).super_WrappedInt<Cycles>.length_ = 0;
  (this->cycles_since_video_update_).super_WrappedInt<Cycles>.length_ = 0;
  (this->cycles_since_6532_update_).super_WrappedInt<Cycles>.length_ = 0;
  return;
}

Assistant:

Bus() :
			tia_sound_(audio_queue_),
			speaker_(tia_sound_) {}